

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_struct_default_trait_impl
          (t_rs_generator *this,string *struct_name,t_struct *tstruct)

{
  bool bVar1;
  bool bVar2;
  e_req req;
  ostream *poVar3;
  reference pptVar4;
  t_type *ttype;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string member_name;
  t_field *member_1;
  t_field **local_c8;
  string local_c0;
  string local_a0;
  string local_70;
  t_field *local_50;
  t_field *member;
  t_field **local_40;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  const_iterator members_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  bool has_required_field;
  t_struct *tstruct_local;
  string *struct_name_local;
  t_rs_generator *this_local;
  
  bVar2 = false;
  members_iter._M_current = (t_field **)t_struct::get_sorted_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_38);
  local_40 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(members_iter._M_current);
  local_38._M_current = local_40;
  do {
    member = (t_field *)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)members_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&member);
    if (!bVar1) {
LAB_0044bd2f:
      if (!bVar2) {
        poVar3 = std::operator<<((ostream *)&this->f_gen_,"impl Default for ");
        poVar3 = std::operator<<(poVar3,(string *)struct_name);
        poVar3 = std::operator<<(poVar3," {");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_70);
        poVar3 = std::operator<<(poVar3,"fn default() -> Self {");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_70);
        t_generator::indent_up(&this->super_t_generator);
        bVar2 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)members_iter._M_current)
        ;
        if (bVar2) {
          t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_a0);
          poVar3 = std::operator<<(poVar3,(string *)struct_name);
          poVar3 = std::operator<<(poVar3,"{}");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_a0);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_c0,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_c0);
          poVar3 = std::operator<<(poVar3,(string *)struct_name);
          poVar3 = std::operator<<(poVar3,"{");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_c0);
          t_generator::indent_up(&this->super_t_generator);
          local_c8 = (t_field **)
                     std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                               (members_iter._M_current);
          local_38._M_current = local_c8;
          while( true ) {
            member_1 = (t_field *)
                       std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)
                                  members_iter._M_current);
            bVar2 = __gnu_cxx::operator!=
                              (&local_38,
                               (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&member_1);
            if (!bVar2) break;
            pptVar4 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*(&local_38);
            member_name.field_2._8_8_ = *pptVar4;
            rust_field_name_abi_cxx11_((string *)local_f8,this,(t_field *)member_name.field_2._8_8_)
            ;
            t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
            poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_118);
            poVar3 = std::operator<<(poVar3,(string *)local_f8);
            poVar3 = std::operator<<(poVar3,": ");
            ttype = t_field::get_type((t_field *)member_name.field_2._8_8_);
            opt_in_req_out_value_abi_cxx11_(&local_138,this,ttype);
            poVar3 = std::operator<<(poVar3,(string *)&local_138);
            poVar3 = std::operator<<(poVar3,",");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)local_f8);
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++(&local_38);
          }
          t_generator::indent_down(&this->super_t_generator);
          t_generator::indent_abi_cxx11_(&local_158,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_158);
          poVar3 = std::operator<<(poVar3,"}");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_158);
        }
        t_generator::indent_down(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_178,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_178);
        poVar3 = std::operator<<(poVar3,"}");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_178);
        t_generator::indent_down(&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,"}");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
      }
      return;
    }
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    local_50 = *pptVar4;
    req = t_field::get_req(local_50);
    bVar1 = is_optional(this,req);
    if (!bVar1) {
      bVar2 = true;
      goto LAB_0044bd2f;
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_38);
  } while( true );
}

Assistant:

void t_rs_generator::render_struct_default_trait_impl(const string& struct_name, t_struct* tstruct) {
  bool has_required_field = false;

  const vector<t_field*>& members = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator members_iter;
  for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
    t_field* member = *members_iter;
    if (!is_optional(member->get_req())) {
      has_required_field = true;
      break;
    }
  }

  if (has_required_field) {
    return;
  }

  f_gen_ << "impl Default for " << struct_name << " {" << endl;
  indent_up();
  f_gen_ << indent() << "fn default() -> Self {" << endl;
  indent_up();

  if (members.empty()) {
    f_gen_ << indent() << struct_name << "{}" << endl;
  } else {
    f_gen_ << indent() << struct_name << "{" << endl;
    indent_up();
    for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field *member = (*members_iter);
      string member_name(rust_field_name(member));
      f_gen_ << indent() << member_name << ": " << opt_in_req_out_value(member->get_type()) << "," << endl;
    }
    indent_down();
    f_gen_ << indent() << "}" << endl;
  }

  indent_down();
  f_gen_ << indent() << "}" << endl;
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}